

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

bool __thiscall gmlc::networking::TcpServer::reConnect(TcpServer *this,milliseconds timeOut)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  TcpServer *in_RCX;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  pointer psVar4;
  allocator<char> local_a9;
  TcpServer *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  rep local_80;
  pointer local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  bVar1 = false;
  LOCK();
  (this->halted)._M_base._M_i = false;
  UNLOCK();
  local_78 = (this->acceptors).
             super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_a8 = this;
  local_80 = timeOut.__r;
  for (psVar4 = (this->acceptors).
                super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != local_78; psVar4 = psVar4 + 1)
  {
    bVar2 = true;
    if ((((psVar4->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr)->state)._M_i != CONNECTED) {
      iVar3 = TcpAcceptor::connect
                        ((psVar4->
                         super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr,(int)local_80,in_RDX,(socklen_t)in_RCX);
      in_RDX = extraout_RDX;
      if ((char)iVar3 == '\0') {
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"unable to connect all acceptors on ",&local_a9);
          TcpAcceptor::to_string_abi_cxx11_
                    (&local_50,
                     (psVar4->
                     super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          std::operator+(&local_70,&local_a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_50);
          logger(local_a8,0,(string *)&local_70);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"unable to connect on ",&local_a9);
          TcpAcceptor::to_string_abi_cxx11_
                    (&local_50,
                     (psVar4->
                     super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          std::operator+(&local_70,&local_a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_50);
          logger(local_a8,0,(string *)&local_70);
        }
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_a0);
        LOCK();
        (local_a8->halted)._M_base._M_i = true;
        UNLOCK();
        in_RCX = local_a8;
        in_RDX = extraout_RDX_00;
        bVar2 = bVar1;
      }
    }
    bVar1 = bVar2;
  }
  if ((((local_a8->halted)._M_base._M_i & 1U) != 0) && (bVar1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"partial connection on acceptor",(allocator<char> *)&local_a0);
    logger(local_a8,0,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return (bool)(~(local_a8->halted)._M_base._M_i & 1);
}

Assistant:

bool TcpServer::reConnect(std::chrono::milliseconds timeOut)
{
    halted = false;
    bool partialConnect = false;
    for (auto& acc : acceptors) {
        if (!acc->isConnected()) {
            if (!acc->connect(timeOut)) {
                if (partialConnect) {
                    logger(
                        0,
                        std::string("unable to connect all acceptors on ") +
                            acc->to_string());
                } else {
                    logger(
                        0,
                        std::string("unable to connect on ") +
                            acc->to_string());
                }

                halted = true;
                continue;
            }
        }
        partialConnect = true;
    }
    if ((halted.load()) && (partialConnect)) {
        logger(0, "partial connection on acceptor");
    }
    return !halted;
}